

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddTime.c
# Opt level: O0

DdNode * Extra_bddAndAbstractTime(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube,int TimeOut)

{
  int local_3c;
  DdNode *pDStack_38;
  int Counter;
  DdNode *res;
  DdNode *pDStack_28;
  int TimeOut_local;
  DdNode *cube_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  local_3c = 0;
  res._4_4_ = TimeOut;
  pDStack_28 = cube;
  cube_local = g;
  g_local = f;
  f_local = &manager->sentinel;
  do {
    *(undefined4 *)&f_local[0xb].next = 0;
    pDStack_38 = cuddBddAndAbstractRecurTime
                           ((DdManager *)f_local,g_local,cube_local,pDStack_28,&local_3c,res._4_4_);
  } while (*(int *)&f_local[0xb].next == 1);
  return pDStack_38;
}

Assistant:

DdNode *
Extra_bddAndAbstractTime(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube,
  int TimeOut)
{
    DdNode *res;
    int Counter = 0;

    do {
	manager->reordered = 0;
	res = cuddBddAndAbstractRecurTime(manager, f, g, cube, &Counter, TimeOut);
    } while (manager->reordered == 1);
    return(res);

}